

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O1

_Bool borg_drop_junk(void)

{
  char cVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int32_t iVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int local_44;
  int local_40;
  int32_t local_3c;
  
  local_3c = borg.power;
  _Var3 = false;
  if ((borg_do_crush_junk) && (_Var3 = false, borg.goal.recalling == L'\0')) {
    _Var3 = false;
    wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
    if (wVar4 <= borg.trait[0x1b] / 10) {
      bVar7 = false;
      if (z_info->pack_size == 0) {
        local_40 = -1;
        lVar10 = 0;
      }
      else {
        local_40 = -1;
        lVar10 = 0;
        uVar11 = 0;
        bVar7 = false;
        do {
          pbVar2 = borg_items;
          if ((((borg_items->curses[lVar10 + -0x26] != false) &&
               (weapon_swap == 0 || uVar11 != weapon_swap - 1)) &&
              (armour_swap == 0 || uVar11 != armour_swap - 1)) &&
             (_Var3 = obj_kind_can_browse(k_info + *(uint *)(borg_items->curses + lVar10 + -0x32)),
             !_Var3)) {
            _Var3 = pbVar2->curses[lVar10 + -0x2a];
            if (_Var3 == true) {
              cVar1 = pbVar2->curses[lVar10 + -0x2e];
joined_r0x00230b19:
              if (cVar1 != '\x01') goto LAB_00230b91;
            }
            else if (_Var3 == true) {
              cVar1 = pbVar2->curses[lVar10 + -0x2c];
              goto joined_r0x00230b19;
            }
            local_44 = *(int *)(pbVar2->curses + lVar10 + -6);
            if (((_Var3 & 0xfeU) == 0x16) &&
               (((pbVar2->curses[lVar10 + -0x2c] != false ||
                 ((*(char **)(pbVar2->curses + lVar10 + -0x3a) != (char *)0x0 &&
                  (pcVar6 = strstr(*(char **)(pbVar2->curses + lVar10 + -0x3a),"empty"),
                  pcVar6 != (char *)0x0)))) &&
                (*(short *)(pbVar2->curses + lVar10 + -0x28) <
                 (short)(ushort)pbVar2->curses[lVar10 + -0x26])))) {
              local_44 = 0;
            }
            uVar8 = (uint)_Var3;
            if ((uVar8 != 0) && ((pbVar2->curses[lVar10 + -0x2e] != false || (local_44 < 1)))) {
              if (((0 < *(short *)((long)pbVar2->modifiers + lVar10)) ||
                  ((((0 < *(short *)((long)pbVar2->modifiers + lVar10 + 2) ||
                     (0 < *(short *)((long)pbVar2->modifiers + lVar10 + 4))) ||
                    (0 < *(short *)((long)pbVar2->modifiers + lVar10 + 6))) ||
                   (0 < *(short *)((long)pbVar2->modifiers + lVar10 + 8))))) && (0 < local_44)) {
                local_44 = local_44 + 2000;
              }
              iVar9 = local_44 + 5000;
              if (local_44 < 1) {
                iVar9 = local_44;
              }
              if (borg.trait[0x98] != uVar8) {
                iVar9 = local_44;
              }
              if ((pbVar2->curses[lVar10 + -0x2c] == true) &&
                 (((((uVar8 == 0x1a &&
                     ((((sv_potion_restore_mana == (uint)pbVar2->curses[lVar10 + -0x29] &&
                        (0 < borg.trait[0x1f])) ||
                       ((sv_potion_healing == (uint)pbVar2->curses[lVar10 + -0x29] ||
                        ((sv_potion_star_healing == (uint)pbVar2->curses[lVar10 + -0x29] ||
                         (sv_potion_life == (uint)pbVar2->curses[lVar10 + -0x29])))))) ||
                      (sv_potion_speed == (uint)pbVar2->curses[lVar10 + -0x29])))) ||
                    ((_Var3 == true &&
                     (((sv_rod_drain_life == (uint)pbVar2->curses[lVar10 + -0x29] ||
                       (sv_rod_healing == (uint)pbVar2->curses[lVar10 + -0x29])) ||
                      ((sv_rod_mapping == (uint)pbVar2->curses[lVar10 + -0x29] &&
                       (borg.trait[0x19] == 0)))))))) ||
                   (((_Var3 == true &&
                     (((sv_staff_dispel_evil == (uint)pbVar2->curses[lVar10 + -0x29] ||
                       (sv_staff_power == (uint)pbVar2->curses[lVar10 + -0x29])) ||
                      (sv_staff_holiness == (uint)pbVar2->curses[lVar10 + -0x29])))) ||
                    ((_Var3 == true &&
                     (((sv_wand_drain_life == (uint)pbVar2->curses[lVar10 + -0x29] ||
                       (sv_wand_annihilation == (uint)pbVar2->curses[lVar10 + -0x29])) ||
                      ((sv_wand_teleport_away == (uint)pbVar2->curses[lVar10 + -0x29] &&
                       (borg.trait[0x19] == 0)))))))))) ||
                  ((((ulong)pbVar2->curses[lVar10 + -0x21] != 0 &&
                    (_Var3 = borg_ego_has_random_power(e_info + pbVar2->curses[lVar10 + -0x21]),
                    _Var3)) ||
                   ((pbVar2->curses[lVar10 + -0x2a] == true &&
                    (((sv_scroll_teleport_level == (uint)pbVar2->curses[lVar10 + -0x29] &&
                      (borg.trait[0xf7] < 1000)) ||
                     (sv_scroll_protection_from_evil == (uint)pbVar2->curses[lVar10 + -0x29]))))))))
                 )) {
                iVar9 = iVar9 + 5000;
              }
              _Var3 = pbVar2->curses[lVar10 + -0x2a];
              local_44 = iVar9;
              if (_Var3 == 6) {
                local_44 = 0;
              }
              if (((byte)(_Var3 - 2U) < 3) && (borg.trait[0x98] != (uint)_Var3)) {
                local_44 = 0;
              }
              if (((((*(int *)(pbVar2->curses + lVar10 + -6) < 1) ||
                    (((borg_cfg[9] == 0 && (9 < borg.trait[0x24])) &&
                     ((borg_cfg[0x18] == 0 || (borg.trait[0x2d] <= borg_cfg[0x18])))))) ||
                   ((0x14 < borg.trait[0x24] || (pbVar2->curses[lVar10 + -2] == true)))) &&
                  ((iVar9 = borg.trait[0x69], 4 < iVar9 || (local_44 < 1)))) &&
                 ((((((((9 < iVar9 || (local_44 < 0x10)) && ((0xe < iVar9 || (local_44 < 0x65)))) &&
                      ((0x1d < iVar9 || (local_44 < 0x1f5)))) &&
                     ((0x27 < iVar9 || (local_44 < 0x3e9)))) &&
                    ((((0x3b < iVar9 || (local_44 < 0x4b1)) &&
                      ((0x4f < iVar9 || (local_44 < 0x579)))) &&
                     ((0x59 < iVar9 || (local_44 < 0x641)))))) &&
                   ((0x5e < iVar9 || (local_44 < 0x12c1)))) &&
                  ((((0x7e < iVar9 || (local_44 < 0x15e1)) &&
                    (_Var3 = borg_item_note_needs_id((borg_item_conflict *)(pbVar2->desc + lVar10)),
                    !_Var3)) &&
                   ((((player->opts).opt[0x1e] != true || (pbVar2->curses[lVar10 + -0x22] == false))
                    || (pbVar2->curses[lVar10 + -0x2e] == true)))))))) {
                borg_items->curses[lVar10 + -0x26] =
                     (_Bool)(borg_items->curses[lVar10 + -0x26] + -1);
                borg_notice(true);
                iVar5 = borg_power();
                memcpy(borg_items->desc + lVar10,safe_items->desc + lVar10,0x388);
                if (local_3c < iVar5) {
                  local_40 = (int)uVar11;
                  local_3c = iVar5;
                }
                bVar7 = true;
              }
            }
          }
LAB_00230b91:
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x388;
        } while (uVar11 < z_info->pack_size);
        lVar10 = (long)local_44;
      }
      pbVar2 = borg_items;
      if (local_40 == -1) {
        if (bVar7) {
          borg_notice(true);
        }
        borg_do_crush_junk = false;
        _Var3 = false;
      }
      else {
        pcVar6 = format("# Dropping junk %s (valued at %ld)",borg_items + local_40,lVar10);
        borg_note(pcVar6);
        borg_keypress(0x7b);
        cVar1 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_40];
        borg_keypress((int)cVar1);
        borg_keypresses("borg ignore");
        borg_keypress(0x9c);
        borg_keypress(100);
        borg_keypress((int)cVar1);
        _Var3 = true;
        if (1 < pbVar2[local_40].iqty) {
          borg_keypress(0x31);
          borg_keypress(0x9c);
        }
      }
    }
  }
  return _Var3;
}

Assistant:

bool borg_drop_junk(void)
{
    int     i, b_i = -1;
    bool    fix = false;
    int32_t p, b_p = borg.power;
    int32_t value;

    /* Hack -- no need */
    if (!borg_do_crush_junk)
        return false;

    /* not while recalling since this is a two step process */
    /* and if the recall kicks in in the middle it confuses things */
    if (borg.goal.recalling)
        return false;

    /* No crush if even slightly dangerous */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false)
        > borg.trait[BI_CURHP] / 10)
        return false;

    /* Destroy actual "junk" items */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* dont crush the swap */
        if (weapon_swap && i == weapon_swap - 1)
            continue;
        if (armour_swap && i == armour_swap - 1)
            continue;

        /* Dont crush weapons if we are weilding a digger */
#if 0
        if (item->tval >= TV_DIGGING && item->tval <= TV_SWORD &&
            borg_items[INVEN_WIELD].tval == TV_DIGGING) continue;
#endif

        /* dont crush our spell books */
        if (obj_kind_can_browse(&k_info[item->kind]))
            continue;

        /* Do not crush unID'd Scrolls, sell them in town */
        if (item->tval == TV_SCROLL && !item->aware)
            continue;

        /* Do not crush Boots, they could be SPEED */
        if (item->tval == TV_BOOTS && !item->ident)
            continue;

        /* save the items value */
        value = item->value;

        /* Crush Stacked Wands and Staves that are empty.
         * ie. 5 Staffs of Teleportation (2 charges).
         * Only 2 charges in 5 staves means top 3 are empty.
         */
        if ((item->tval == TV_STAFF || item->tval == TV_WAND)
            && (item->aware || (item->note && strstr(item->note, "empty")))) {
            if (item->iqty > item->pval)
                value = 0L;
        }

        /* Skip non "worthless" items */
        if (item->tval >= TV_CHEST) {
            /* unknown and not worthless */
            if (!item->ident && value > 0)
                continue;

            /* skip items that are 'valuable'.  This is level dependent */
            /* try to make the borg junk +1,+1 dagger at level 40 */

            /* if the item gives a bonus to a stat, boost its value */
            if ((item->modifiers[OBJ_MOD_STR] > 0
                || item->modifiers[OBJ_MOD_INT] > 0
                || item->modifiers[OBJ_MOD_WIS] > 0
                || item->modifiers[OBJ_MOD_DEX] > 0
                || item->modifiers[OBJ_MOD_CON] > 0)
                && value > 0) {
                value += 2000L;
            }

            /* Keep some stuff */
            if (item->tval == borg.trait[BI_AMMO_TVAL] && value > 0)
            {
                value += 5000L;
            }

            if (item->aware && (((item->tval == TV_POTION
                    && item->sval == sv_potion_restore_mana)
                    && (borg.trait[BI_MAXSP] >= 1))
                || (item->tval == TV_POTION && item->sval == sv_potion_healing)
                || (item->tval == TV_POTION
                    && item->sval == sv_potion_star_healing)
                || (item->tval == TV_POTION && item->sval == sv_potion_life)
                || (item->tval == TV_POTION && item->sval == sv_potion_speed)
                || (item->tval == TV_ROD && item->sval == sv_rod_drain_life)
                || (item->tval == TV_ROD && item->sval == sv_rod_healing)
                || (item->tval == TV_ROD && item->sval == sv_rod_mapping
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->tval == TV_STAFF
                    && item->sval == sv_staff_dispel_evil)
                || (item->tval == TV_STAFF && item->sval == sv_staff_power)
                || (item->tval == TV_STAFF && item->sval == sv_staff_holiness)
                || (item->tval == TV_WAND && item->sval == sv_wand_drain_life)
                || (item->tval == TV_WAND && item->sval == sv_wand_annihilation)
                || (item->tval == TV_WAND && item->sval == sv_wand_teleport_away
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->ego_idx
                    && borg_ego_has_random_power(&e_info[item->ego_idx]))
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_teleport_level
                    && borg.trait[BI_ATELEPORTLVL] < 1000)
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_protection_from_evil)))

            {
                value += 5000L;
            }

            /* Go Ahead and crush diggers */
            if (item->tval == TV_DIGGING)
                value = 0L;

            /* Crush missiles that aren't mine */
            if (item->tval == TV_SHOT || item->tval == TV_ARROW
                || item->tval == TV_BOLT) {
                if (item->tval != borg.trait[BI_AMMO_TVAL])
                    value = 0L;
            }

            /* borg_worships_gold will sell all kinds of stuff,
             * except {cursed} is junk
             */
            if (item->value > 0
                && ((borg_cfg[BORG_WORSHIPS_GOLD]
                    || borg.trait[BI_MAXCLEVEL] < 10)
                    || ((borg_cfg[BORG_MONEY_SCUM_AMOUNT] < borg.trait[BI_GOLD])
                        && borg_cfg[BORG_MONEY_SCUM_AMOUNT] != 0))
                && borg.trait[BI_MAXCLEVEL] <= 20 && !item->cursed)
                continue;

            /* up to level 5, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 5 && value > 0)
                continue;
            /* up to level 10, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 10 && value > 15)
                continue;
            /* up to level 15, keep anything of value 100 or better */
            if (borg.trait[BI_CDEPTH] < 15 && value > 100)
                continue;
            /* up to level 30, keep anything of value 500 or better */
            if (borg.trait[BI_CDEPTH] < 30 && value > 500)
                continue;
            /* up to level 40, keep anything of value 1000 or better */
            if (borg.trait[BI_CDEPTH] < 40 && value > 1000)
                continue;
            /* up to level 60, keep anything of value 1200 or better */
            if (borg.trait[BI_CDEPTH] < 60 && value > 1200)
                continue;
            /* up to level 80, keep anything of value 1400 or better */
            if (borg.trait[BI_CDEPTH] < 80 && value > 1400)
                continue;
            /* up to level 90, keep anything of value 1600 or better */
            if (borg.trait[BI_CDEPTH] < 90 && value > 1600)
                continue;
            /* up to level 95, keep anything of value 4800 or better */
            if (borg.trait[BI_CDEPTH] < 95 && value > 4800)
                continue;
            /* below level 127, keep anything of value 2000 or better */
            if (borg.trait[BI_CDEPTH] < 127 && value > 5600)
                continue;

            /* Hack -- skip good un-id'd "artifacts" */
            if (borg_item_note_needs_id(item))
                continue;

            /* hack --  with random artifacts some are good and bad */
            /*         so check them all */
            if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
                continue;

            /* Destroy one item */
            borg_items[i].iqty -= 1;

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the inventory */
            p = borg_power();

            /* Restore the item */
            memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

            /* skip things we are using */
            if (p > b_p) {
                b_p = p;
                b_i = i;
            }

        }
    }

    /* if we found something junky, junk it */
    if ( b_i != -1) {
        borg_item *item = &borg_items[b_i];

        /* Message */
        borg_note(format("# Dropping junk %s (valued at %ld)", item->desc, (long int)value));

        /* inscribe "borg ignore". The borg crushes all items */
        /* on the floor that are inscribed this way */
        borg_keypress('{');
        borg_keypress(all_letters_nohjkl[b_i]);
        borg_keypresses("borg ignore");
        borg_keypress(KC_ENTER);

        /* drop it then ignore it */
        borg_keypress('d');
        borg_keypress(all_letters_nohjkl[b_i]);

        if (item->iqty > 1) {
            borg_keypress('1');
            borg_keypress(KC_ENTER);
        }

        /* Success */
        return true;
    }

    /* re-examine the inventory */
    if (fix)
        borg_notice(true);

    /* Hack -- no need */
    borg_do_crush_junk = false;

    /* Nothing to destroy */
    return false;
}